

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *constNode)

{
  int iVar1;
  bool bVar2;
  bool dummy2;
  uint dummy1;
  bool local_a9;
  PointerReader local_a8;
  StructReader local_88;
  StructReader local_58;
  
  bVar2 = (constNode->_reader).pointerCount < 4;
  local_88.data = (constNode->_reader).pointers + 3;
  if (bVar2) {
    local_88.data = (WirePointer *)0x0;
  }
  iVar1 = 0x7fffffff;
  local_88.pointers._0_4_ = (constNode->_reader).nestingLimit;
  if (bVar2) {
    local_88.pointers._0_4_ = 0x7fffffff;
    local_88.segment._0_4_ = 0;
    local_88.segment._4_4_ = 0;
    local_88.capTable._0_4_ = 0;
    local_88.capTable._4_4_ = 0;
  }
  else {
    local_88.segment._0_4_ = *(undefined4 *)&(constNode->_reader).segment;
    local_88.segment._4_4_ = *(undefined4 *)((long)&(constNode->_reader).segment + 4);
    local_88.capTable._0_4_ = *(undefined4 *)&(constNode->_reader).capTable;
    local_88.capTable._4_4_ = *(undefined4 *)((long)&(constNode->_reader).capTable + 4);
  }
  _::PointerReader::getStruct(&local_58,(PointerReader *)&local_88,(word *)0x0);
  bVar2 = 4 < (constNode->_reader).pointerCount;
  local_a8.pointer = (WirePointer *)0x0;
  if (bVar2) {
    iVar1 = (constNode->_reader).nestingLimit;
    local_a8.pointer = (constNode->_reader).pointers + 4;
  }
  local_a8.segment._0_4_ = 0;
  local_a8.segment._4_4_ = 0;
  local_a8.capTable._0_4_ = 0;
  local_a8.capTable._4_4_ = 0;
  if (bVar2) {
    local_a8.segment._0_4_ = *(undefined4 *)&(constNode->_reader).segment;
    local_a8.segment._4_4_ = *(undefined4 *)((long)&(constNode->_reader).segment + 4);
    local_a8.capTable._0_4_ = *(undefined4 *)&(constNode->_reader).capTable;
    local_a8.capTable._4_4_ = *(undefined4 *)((long)&(constNode->_reader).capTable + 4);
  }
  local_a8.nestingLimit = iVar1;
  _::PointerReader::getStruct(&local_88,&local_a8,(word *)0x0);
  validate(this,(Reader *)&local_58,(Reader *)&local_88,(uint *)&local_a8,&local_a9);
  return;
}

Assistant:

void validate(const schema::Node::Const::Reader& constNode) {
    uint dummy1;
    bool dummy2;
    validate(constNode.getType(), constNode.getValue(), &dummy1, &dummy2);
  }